

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_add_itext(LodePNGInfo *info,char *key,char *langtag,char *transkey,char *str)

{
  char **ptr;
  char **ptr_00;
  char **ptr_01;
  char **ptr_02;
  char **new_strings;
  char **new_transkeys;
  char **new_langtags;
  char **new_keys;
  char *str_local;
  char *transkey_local;
  char *langtag_local;
  char *key_local;
  LodePNGInfo *info_local;
  
  ptr = (char **)lodepng_realloc(info->itext_keys,(info->itext_num + 1) * 8);
  ptr_00 = (char **)lodepng_realloc(info->itext_langtags,(info->itext_num + 1) * 8);
  ptr_01 = (char **)lodepng_realloc(info->itext_transkeys,(info->itext_num + 1) * 8);
  ptr_02 = (char **)lodepng_realloc(info->itext_strings,(info->itext_num + 1) * 8);
  if ((((ptr == (char **)0x0) || (ptr_00 == (char **)0x0)) || (ptr_01 == (char **)0x0)) ||
     (ptr_02 == (char **)0x0)) {
    lodepng_free(ptr);
    lodepng_free(ptr_00);
    lodepng_free(ptr_01);
    lodepng_free(ptr_02);
    info_local._4_4_ = 0x53;
  }
  else {
    info->itext_num = info->itext_num + 1;
    info->itext_keys = ptr;
    info->itext_langtags = ptr_00;
    info->itext_transkeys = ptr_01;
    info->itext_strings = ptr_02;
    string_init(info->itext_keys + (info->itext_num - 1));
    string_set(info->itext_keys + (info->itext_num - 1),key);
    string_init(info->itext_langtags + (info->itext_num - 1));
    string_set(info->itext_langtags + (info->itext_num - 1),langtag);
    string_init(info->itext_transkeys + (info->itext_num - 1));
    string_set(info->itext_transkeys + (info->itext_num - 1),transkey);
    string_init(info->itext_strings + (info->itext_num - 1));
    string_set(info->itext_strings + (info->itext_num - 1),str);
    info_local._4_4_ = 0;
  }
  return info_local._4_4_;
}

Assistant:

unsigned lodepng_add_itext(LodePNGInfo* info, const char* key, const char* langtag,
                           const char* transkey, const char* str)
{
  char** new_keys = (char**)(lodepng_realloc(info->itext_keys, sizeof(char*) * (info->itext_num + 1)));
  char** new_langtags = (char**)(lodepng_realloc(info->itext_langtags, sizeof(char*) * (info->itext_num + 1)));
  char** new_transkeys = (char**)(lodepng_realloc(info->itext_transkeys, sizeof(char*) * (info->itext_num + 1)));
  char** new_strings = (char**)(lodepng_realloc(info->itext_strings, sizeof(char*) * (info->itext_num + 1)));
  if(!new_keys || !new_langtags || !new_transkeys || !new_strings)
  {
    lodepng_free(new_keys);
    lodepng_free(new_langtags);
    lodepng_free(new_transkeys);
    lodepng_free(new_strings);
    return 83; /*alloc fail*/
  }

  ++info->itext_num;
  info->itext_keys = new_keys;
  info->itext_langtags = new_langtags;
  info->itext_transkeys = new_transkeys;
  info->itext_strings = new_strings;

  string_init(&info->itext_keys[info->itext_num - 1]);
  string_set(&info->itext_keys[info->itext_num - 1], key);

  string_init(&info->itext_langtags[info->itext_num - 1]);
  string_set(&info->itext_langtags[info->itext_num - 1], langtag);

  string_init(&info->itext_transkeys[info->itext_num - 1]);
  string_set(&info->itext_transkeys[info->itext_num - 1], transkey);

  string_init(&info->itext_strings[info->itext_num - 1]);
  string_set(&info->itext_strings[info->itext_num - 1], str);

  return 0;
}